

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O3

size_t ZSTD_decompressStream(ZSTD_DStream *zds,ZSTD_outBuffer *output,ZSTD_inBuffer *input)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  ZSTD_inBuffer *pZVar4;
  ZSTD_customMem *pZVar5;
  ZSTD_dStage ZVar6;
  ZSTD_DDict *pZVar7;
  ulong uVar8;
  char *pcVar9;
  size_t __n;
  size_t sVar10;
  ulong uVar11;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  char *oend;
  ZSTD_frameSizeInfo ZVar15;
  void *local_b8;
  char *local_b0;
  void *local_a8;
  void *local_a0;
  ZSTD_inBuffer *local_98;
  ZSTD_outBuffer *local_90;
  ulong local_88;
  ulong local_80;
  char *local_78;
  ZSTD_frameHeader *local_70;
  BYTE *local_68;
  size_t *local_60;
  ulong local_58;
  ZSTD_outBuffer *local_50;
  ulong local_48;
  ZSTD_customMem *local_40;
  ulong local_38;
  
  local_48 = input->pos;
  local_80 = input->size;
  pvVar3 = output->dst;
  local_88 = output->size;
  local_58 = output->pos;
  local_b0 = (char *)((long)pvVar3 + local_58);
  sVar12 = 0xffffffffffffffb8;
  local_38 = local_80 - local_48;
  if (local_48 <= local_80) {
    if (local_88 < local_58) {
LAB_0022ff25:
      sVar12 = 0xffffffffffffffba;
    }
    else if (((zds->outBufferMode != ZSTD_bm_stable) || (zds->streamStage == zdss_init)) ||
            ((sVar12 = 0xffffffffffffff98, (zds->expectedOutBuffer).dst == pvVar3 &&
             (((zds->expectedOutBuffer).pos == local_58 &&
              ((zds->expectedOutBuffer).size == local_88)))))) {
      local_a0 = (void *)(local_48 + (long)input->src);
      local_a8 = (void *)((long)input->src + local_80);
      oend = (char *)((long)pvVar3 + local_88);
      local_50 = &zds->expectedOutBuffer;
      local_60 = &zds->outStart;
      local_70 = &zds->fParams;
      local_68 = zds->headerBuffer;
      local_40 = &zds->customMem;
      pcVar9 = local_b0;
      local_98 = input;
      local_90 = output;
      local_78 = local_b0;
      local_b8 = local_a0;
      while( true ) {
        while( true ) {
          while (zds->streamStage == zdss_flush) {
            sVar12 = zds->outStart;
            uVar13 = zds->outEnd - sVar12;
            uVar11 = (long)oend - (long)pcVar9;
            uVar14 = uVar13;
            if (uVar11 < uVar13) {
              uVar14 = uVar11;
            }
            if (uVar14 != 0) {
              memcpy(pcVar9,zds->outBuff + sVar12,uVar14);
              sVar12 = zds->outStart;
            }
            pcVar9 = pcVar9 + uVar14;
            *local_60 = sVar12 + uVar14;
            if (uVar11 < uVar13) goto LAB_002305ae;
            zds->streamStage = zdss_read;
            if ((zds->outBuffSize < (zds->fParams).frameContentSize) &&
               (zds->outBuffSize < sVar12 + uVar14 + (ulong)(zds->fParams).blockSizeMax)) {
              *local_60 = 0;
              local_60[1] = 0;
            }
          }
          local_b0 = pcVar9;
          switch(zds->streamStage) {
          case zdss_init:
            zds->streamStage = zdss_loadHeader;
            zds->inPos = 0;
            zds->legacyVersion = 0;
            zds->hostageByte = 0;
            local_60[2] = 0;
            *local_60 = 0;
            local_60[1] = 0;
            local_50->pos = local_90->pos;
            sVar12 = local_90->size;
            local_50->dst = local_90->dst;
            local_50->size = sVar12;
            sVar12 = 0;
            break;
          case zdss_loadHeader:
            sVar12 = zds->lhSize;
            break;
          case zdss_read:
            goto LAB_00230428;
          case zdss_load:
            sVar12 = zds->expected;
            ZVar6 = zds->stage;
            goto LAB_0023047c;
          default:
            return 0xffffffffffffffff;
          }
          sVar12 = ZSTD_getFrameHeader_advanced(local_70,local_68,sVar12,zds->format);
          if ((zds->refMultipleDDicts != ZSTD_rmd_refSingleDDict) &&
             (zds->ddictSet != (ZSTD_DDictHashSet *)0x0)) {
            ZSTD_DCtx_selectFrameDDict(zds);
          }
          uVar14 = local_38;
          pZVar4 = local_98;
          pcVar9 = local_b0;
          if (0xffffffffffffff88 < sVar12) {
            return sVar12;
          }
          if (sVar12 == 0) break;
          sVar10 = zds->lhSize;
          uVar14 = sVar12 - sVar10;
          uVar11 = (long)local_a8 - (long)local_b8;
          if (uVar11 < uVar14) {
            if (local_a8 != local_b8) {
              memcpy(local_68 + sVar10,local_b8,uVar11);
              sVar10 = uVar11 + zds->lhSize;
              zds->lhSize = sVar10;
            }
            pZVar4->pos = pZVar4->size;
            uVar14 = (ulong)(zds->format == ZSTD_f_zstd1) * 4 + 2;
            if (sVar12 < uVar14) {
              sVar12 = uVar14;
            }
            return (sVar12 - sVar10) + 3;
          }
          memcpy(local_68 + sVar10,local_b8,uVar14);
          zds->lhSize = sVar12;
          local_b8 = (void *)((long)local_b8 + uVar14);
          pcVar9 = local_b0;
        }
        if (((local_70->frameContentSize != 0xffffffffffffffff) &&
            ((zds->fParams).frameType != ZSTD_skippableFrame)) &&
           (uVar11 = (long)oend - (long)local_b0, local_70->frameContentSize <= uVar11)) break;
LAB_0023021c:
        if (((zds->outBufferMode == ZSTD_bm_stable) &&
            ((zds->fParams).frameType != ZSTD_skippableFrame)) &&
           ((local_70->frameContentSize != 0xffffffffffffffff &&
            ((ulong)((long)oend - (long)local_b0) < local_70->frameContentSize))))
        goto LAB_0022ff25;
        pZVar7 = ZSTD_getDDict(zds);
        ZSTD_decompressBegin_usingDDict(zds,pZVar7);
        if ((*(uint *)zds->headerBuffer & 0xfffffff0) == 0x184d2a50) {
          uVar14 = (ulong)*(uint *)(zds->headerBuffer + 4);
          ZVar6 = ZSTDds_skipFrame;
        }
        else {
          sVar12 = ZSTD_decodeFrameHeader(zds,local_68,zds->lhSize);
          if (0xffffffffffffff88 < sVar12) {
            return sVar12;
          }
          ZVar6 = ZSTDds_decodeBlockHeader;
          uVar14 = 3;
        }
        pZVar5 = local_40;
        zds->expected = uVar14;
        zds->stage = ZVar6;
        uVar14 = (zds->fParams).windowSize;
        if (uVar14 < 0x401) {
          uVar14 = 0x400;
        }
        (zds->fParams).windowSize = uVar14;
        if (zds->maxWindowSize < uVar14) {
          return 0xfffffffffffffff0;
        }
        uVar1 = (zds->fParams).blockSizeMax;
        if (uVar1 < 5) {
          uVar1 = 4;
        }
        uVar11 = (ulong)uVar1;
        if (zds->outBufferMode == ZSTD_bm_buffered) {
          uVar13 = 0x20000;
          if (uVar14 < 0x20000) {
            uVar13 = uVar14;
          }
          uVar13 = uVar14 + uVar13 + 0x40;
          uVar14 = local_70->frameContentSize;
          if (uVar13 < local_70->frameContentSize) {
            uVar14 = uVar13;
          }
        }
        else {
          uVar14 = 0;
        }
        uVar13 = uVar14 + uVar11;
        if (zds->outBuffSize + zds->inBuffSize < uVar13 * 3) {
          uVar8 = 0;
        }
        else {
          uVar8 = zds->oversizedDuration + 1;
        }
        zds->oversizedDuration = uVar8;
        if ((zds->inBuffSize < uVar11) || (0x7f < uVar8 || zds->outBuffSize < uVar14)) {
          if (zds->staticSize == 0) {
            ZSTD_customFree(zds->inBuff,*local_40);
            zds->inBuffSize = 0;
            zds->outBuffSize = 0;
            pcVar9 = (char *)ZSTD_customMalloc(uVar13,*pZVar5);
            zds->inBuff = pcVar9;
            if (pcVar9 == (char *)0x0) {
              return 0xffffffffffffffc0;
            }
          }
          else {
            if (zds->staticSize - 0x276d8 < uVar13) {
              return 0xffffffffffffffc0;
            }
            pcVar9 = zds->inBuff;
          }
          zds->inBuffSize = uVar11;
          zds->outBuff = pcVar9 + uVar11;
          zds->outBuffSize = uVar14;
        }
        zds->streamStage = zdss_read;
LAB_00230428:
        uVar14 = (long)local_a8 - (long)local_b8;
        ZVar6 = zds->stage;
        if ((ZVar6 - ZSTDds_decompressBlock < 2) && (zds->bType == bt_raw)) {
          uVar11 = uVar14 + (uVar14 == 0);
          sVar12 = zds->expected;
          if (sVar12 <= uVar11) {
            uVar11 = sVar12;
          }
        }
        else {
          sVar12 = zds->expected;
          uVar11 = sVar12;
        }
        if (uVar11 == 0) goto LAB_002306cc;
        if (uVar14 < uVar11) {
          if (local_b8 == local_a8) {
            local_b8 = local_a8;
            pcVar9 = local_b0;
          }
          else {
            zds->streamStage = zdss_load;
LAB_0023047c:
            sVar10 = zds->inPos;
            uVar14 = sVar12 - sVar10;
            if (ZVar6 == ZSTDds_skipFrame) {
              __n = (long)local_a8 - (long)local_b8;
              if (uVar14 < (ulong)((long)local_a8 - (long)local_b8)) {
                __n = uVar14;
              }
            }
            else {
              if (zds->inBuffSize - sVar10 < uVar14) {
                return 0xffffffffffffffec;
              }
              __n = (long)local_a8 - (long)local_b8;
              if (uVar14 < (ulong)((long)local_a8 - (long)local_b8)) {
                __n = uVar14;
              }
              if (__n == 0) {
                __n = 0;
              }
              else {
                memcpy(zds->inBuff + sVar10,local_b8,__n);
                sVar10 = zds->inPos;
              }
            }
            local_b8 = (void *)((long)local_b8 + __n);
            zds->inPos = sVar10 + __n;
            pcVar9 = local_b0;
            if (uVar14 <= __n) {
              zds->inPos = 0;
              uVar14 = ZSTD_decompressContinueStream(zds,&local_b0,oend,zds->inBuff,sVar12);
              goto LAB_0023054d;
            }
          }
          goto LAB_002305ae;
        }
        uVar14 = ZSTD_decompressContinueStream(zds,&local_b0,oend,local_b8,uVar11);
        local_b8 = (void *)((long)local_b8 + uVar11);
LAB_0023054d:
        pcVar9 = local_b0;
        if (0xffffffffffffff88 < uVar14) {
          return uVar14;
        }
      }
      ZVar15 = ZSTD_findFrameSizeInfo(local_a0,local_38);
      uVar13 = ZVar15.compressedSize;
      if (uVar14 < uVar13) goto LAB_0023021c;
      pZVar7 = ZSTD_getDDict(zds);
      pvVar3 = local_a0;
      sVar12 = ZSTD_decompressMultiFrame(zds,pcVar9,uVar11,local_a0,uVar13,(void *)0x0,0,pZVar7);
      if (0xffffffffffffff88 < sVar12) {
        return sVar12;
      }
      local_b8 = (void *)(uVar13 + (long)pvVar3);
      local_b0 = pcVar9 + sVar12;
      zds->expected = 0;
      local_a0 = pvVar3;
LAB_002306cc:
      zds->streamStage = zdss_init;
      pcVar9 = local_b0;
LAB_002305ae:
      local_b0 = pcVar9;
      local_98->pos = (long)local_b8 - (long)local_98->src;
      sVar12 = (long)local_b0 - (long)local_90->dst;
      local_90->pos = sVar12;
      local_50->pos = sVar12;
      sVar12 = local_90->size;
      local_50->dst = local_90->dst;
      local_50->size = sVar12;
      if (local_78 == local_b0 && local_a0 == local_b8) {
        iVar2 = zds->noForwardProgress;
        zds->noForwardProgress = iVar2 + 1;
        if (0xe < iVar2) {
          if (local_58 == local_88) {
            return 0xffffffffffffffba;
          }
          if (local_80 == local_48) {
            return 0xffffffffffffffb8;
          }
        }
      }
      else {
        zds->noForwardProgress = 0;
      }
      if (zds->expected != 0) {
        return (zds->expected - zds->inPos) + (ulong)(zds->stage == ZSTDds_decompressBlock) * 3;
      }
      if (zds->outEnd != zds->outStart) {
        if (zds->hostageByte == 0) {
          local_98->pos = local_98->pos - 1;
          zds->hostageByte = 1;
          return 1;
        }
        return 1;
      }
      if (zds->hostageByte != 0) {
        if (local_98->size <= local_98->pos) {
          zds->streamStage = zdss_read;
          return 1;
        }
        local_98->pos = local_98->pos + 1;
      }
      sVar12 = 0;
    }
  }
  return sVar12;
}

Assistant:

size_t ZSTD_decompressStream(ZSTD_DStream* zds, ZSTD_outBuffer* output, ZSTD_inBuffer* input)
{
    const char* const src = (const char*)input->src;
    const char* const istart = input->pos != 0 ? src + input->pos : src;
    const char* const iend = input->size != 0 ? src + input->size : src;
    const char* ip = istart;
    char* const dst = (char*)output->dst;
    char* const ostart = output->pos != 0 ? dst + output->pos : dst;
    char* const oend = output->size != 0 ? dst + output->size : dst;
    char* op = ostart;
    U32 someMoreWork = 1;

    DEBUGLOG(5, "ZSTD_decompressStream");
    RETURN_ERROR_IF(
        input->pos > input->size,
        srcSize_wrong,
        "forbidden. in: pos: %u   vs size: %u",
        (U32)input->pos, (U32)input->size);
    RETURN_ERROR_IF(
        output->pos > output->size,
        dstSize_tooSmall,
        "forbidden. out: pos: %u   vs size: %u",
        (U32)output->pos, (U32)output->size);
    DEBUGLOG(5, "input size : %u", (U32)(input->size - input->pos));
    FORWARD_IF_ERROR(ZSTD_checkOutBuffer(zds, output), "");

    while (someMoreWork) {
        switch(zds->streamStage)
        {
        case zdss_init :
            DEBUGLOG(5, "stage zdss_init => transparent reset ");
            zds->streamStage = zdss_loadHeader;
            zds->lhSize = zds->inPos = zds->outStart = zds->outEnd = 0;
            zds->legacyVersion = 0;
            zds->hostageByte = 0;
            zds->expectedOutBuffer = *output;
            /* fall-through */

        case zdss_loadHeader :
            DEBUGLOG(5, "stage zdss_loadHeader (srcSize : %u)", (U32)(iend - ip));
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
            if (zds->legacyVersion) {
                RETURN_ERROR_IF(zds->staticSize, memory_allocation,
                    "legacy support is incompatible with static dctx");
                {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, zds->legacyVersion, output, input);
                    if (hint==0) zds->streamStage = zdss_init;
                    return hint;
            }   }
#endif
            {   size_t const hSize = ZSTD_getFrameHeader_advanced(&zds->fParams, zds->headerBuffer, zds->lhSize, zds->format);
                if (zds->refMultipleDDicts && zds->ddictSet) {
                    ZSTD_DCtx_selectFrameDDict(zds);
                }
                DEBUGLOG(5, "header size : %u", (U32)hSize);
                if (ZSTD_isError(hSize)) {
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
                    U32 const legacyVersion = ZSTD_isLegacy(istart, iend-istart);
                    if (legacyVersion) {
                        ZSTD_DDict const* const ddict = ZSTD_getDDict(zds);
                        const void* const dict = ddict ? ZSTD_DDict_dictContent(ddict) : NULL;
                        size_t const dictSize = ddict ? ZSTD_DDict_dictSize(ddict) : 0;
                        DEBUGLOG(5, "ZSTD_decompressStream: detected legacy version v0.%u", legacyVersion);
                        RETURN_ERROR_IF(zds->staticSize, memory_allocation,
                            "legacy support is incompatible with static dctx");
                        FORWARD_IF_ERROR(ZSTD_initLegacyStream(&zds->legacyContext,
                                    zds->previousLegacyVersion, legacyVersion,
                                    dict, dictSize), "");
                        zds->legacyVersion = zds->previousLegacyVersion = legacyVersion;
                        {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, legacyVersion, output, input);
                            if (hint==0) zds->streamStage = zdss_init;   /* or stay in stage zdss_loadHeader */
                            return hint;
                    }   }
#endif
                    return hSize;   /* error */
                }
                if (hSize != 0) {   /* need more input */
                    size_t const toLoad = hSize - zds->lhSize;   /* if hSize!=0, hSize > zds->lhSize */
                    size_t const remainingInput = (size_t)(iend-ip);
                    assert(iend >= ip);
                    if (toLoad > remainingInput) {   /* not enough input to load full header */
                        if (remainingInput > 0) {
                            ZSTD_memcpy(zds->headerBuffer + zds->lhSize, ip, remainingInput);
                            zds->lhSize += remainingInput;
                        }
                        input->pos = input->size;
                        return (MAX((size_t)ZSTD_FRAMEHEADERSIZE_MIN(zds->format), hSize) - zds->lhSize) + ZSTD_blockHeaderSize;   /* remaining header bytes + next block header */
                    }
                    assert(ip != NULL);
                    ZSTD_memcpy(zds->headerBuffer + zds->lhSize, ip, toLoad); zds->lhSize = hSize; ip += toLoad;
                    break;
            }   }

            /* check for single-pass mode opportunity */
            if (zds->fParams.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN
                && zds->fParams.frameType != ZSTD_skippableFrame
                && (U64)(size_t)(oend-op) >= zds->fParams.frameContentSize) {
                size_t const cSize = ZSTD_findFrameCompressedSize(istart, (size_t)(iend-istart));
                if (cSize <= (size_t)(iend-istart)) {
                    /* shortcut : using single-pass mode */
                    size_t const decompressedSize = ZSTD_decompress_usingDDict(zds, op, (size_t)(oend-op), istart, cSize, ZSTD_getDDict(zds));
                    if (ZSTD_isError(decompressedSize)) return decompressedSize;
                    DEBUGLOG(4, "shortcut to single-pass ZSTD_decompress_usingDDict()")
                    ip = istart + cSize;
                    op += decompressedSize;
                    zds->expected = 0;
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
            }   }

            /* Check output buffer is large enough for ZSTD_odm_stable. */
            if (zds->outBufferMode == ZSTD_bm_stable
                && zds->fParams.frameType != ZSTD_skippableFrame
                && zds->fParams.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN
                && (U64)(size_t)(oend-op) < zds->fParams.frameContentSize) {
                RETURN_ERROR(dstSize_tooSmall, "ZSTD_obm_stable passed but ZSTD_outBuffer is too small");
            }

            /* Consume header (see ZSTDds_decodeFrameHeader) */
            DEBUGLOG(4, "Consume header");
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDDict(zds, ZSTD_getDDict(zds)), "");

            if ((MEM_readLE32(zds->headerBuffer) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {  /* skippable frame */
                zds->expected = MEM_readLE32(zds->headerBuffer + ZSTD_FRAMEIDSIZE);
                zds->stage = ZSTDds_skipFrame;
            } else {
                FORWARD_IF_ERROR(ZSTD_decodeFrameHeader(zds, zds->headerBuffer, zds->lhSize), "");
                zds->expected = ZSTD_blockHeaderSize;
                zds->stage = ZSTDds_decodeBlockHeader;
            }

            /* control buffer memory usage */
            DEBUGLOG(4, "Control max memory usage (%u KB <= max %u KB)",
                        (U32)(zds->fParams.windowSize >>10),
                        (U32)(zds->maxWindowSize >> 10) );
            zds->fParams.windowSize = MAX(zds->fParams.windowSize, 1U << ZSTD_WINDOWLOG_ABSOLUTEMIN);
            RETURN_ERROR_IF(zds->fParams.windowSize > zds->maxWindowSize,
                            frameParameter_windowTooLarge, "");

            /* Adapt buffer sizes to frame header instructions */
            {   size_t const neededInBuffSize = MAX(zds->fParams.blockSizeMax, 4 /* frame checksum */);
                size_t const neededOutBuffSize = zds->outBufferMode == ZSTD_bm_buffered
                        ? ZSTD_decodingBufferSize_min(zds->fParams.windowSize, zds->fParams.frameContentSize)
                        : 0;

                ZSTD_DCtx_updateOversizedDuration(zds, neededInBuffSize, neededOutBuffSize);

                {   int const tooSmall = (zds->inBuffSize < neededInBuffSize) || (zds->outBuffSize < neededOutBuffSize);
                    int const tooLarge = ZSTD_DCtx_isOversizedTooLong(zds);

                    if (tooSmall || tooLarge) {
                        size_t const bufferSize = neededInBuffSize + neededOutBuffSize;
                        DEBUGLOG(4, "inBuff  : from %u to %u",
                                    (U32)zds->inBuffSize, (U32)neededInBuffSize);
                        DEBUGLOG(4, "outBuff : from %u to %u",
                                    (U32)zds->outBuffSize, (U32)neededOutBuffSize);
                        if (zds->staticSize) {  /* static DCtx */
                            DEBUGLOG(4, "staticSize : %u", (U32)zds->staticSize);
                            assert(zds->staticSize >= sizeof(ZSTD_DCtx));  /* controlled at init */
                            RETURN_ERROR_IF(
                                bufferSize > zds->staticSize - sizeof(ZSTD_DCtx),
                                memory_allocation, "");
                        } else {
                            ZSTD_customFree(zds->inBuff, zds->customMem);
                            zds->inBuffSize = 0;
                            zds->outBuffSize = 0;
                            zds->inBuff = (char*)ZSTD_customMalloc(bufferSize, zds->customMem);
                            RETURN_ERROR_IF(zds->inBuff == NULL, memory_allocation, "");
                        }
                        zds->inBuffSize = neededInBuffSize;
                        zds->outBuff = zds->inBuff + zds->inBuffSize;
                        zds->outBuffSize = neededOutBuffSize;
            }   }   }
            zds->streamStage = zdss_read;
            /* fall-through */

        case zdss_read:
            DEBUGLOG(5, "stage zdss_read");
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompressWithInputSize(zds, (size_t)(iend - ip));
                DEBUGLOG(5, "neededInSize = %u", (U32)neededInSize);
                if (neededInSize==0) {  /* end of frame */
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
                }
                if ((size_t)(iend-ip) >= neededInSize) {  /* decode directly from src */
                    FORWARD_IF_ERROR(ZSTD_decompressContinueStream(zds, &op, oend, ip, neededInSize), "");
                    ip += neededInSize;
                    /* Function modifies the stage so we must break */
                    break;
            }   }
            if (ip==iend) { someMoreWork = 0; break; }   /* no more input */
            zds->streamStage = zdss_load;
            /* fall-through */

        case zdss_load:
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompress(zds);
                size_t const toLoad = neededInSize - zds->inPos;
                int const isSkipFrame = ZSTD_isSkipFrame(zds);
                size_t loadedSize;
                /* At this point we shouldn't be decompressing a block that we can stream. */
                assert(neededInSize == ZSTD_nextSrcSizeToDecompressWithInputSize(zds, iend - ip));
                if (isSkipFrame) {
                    loadedSize = MIN(toLoad, (size_t)(iend-ip));
                } else {
                    RETURN_ERROR_IF(toLoad > zds->inBuffSize - zds->inPos,
                                    corruption_detected,
                                    "should never happen");
                    loadedSize = ZSTD_limitCopy(zds->inBuff + zds->inPos, toLoad, ip, (size_t)(iend-ip));
                }
                ip += loadedSize;
                zds->inPos += loadedSize;
                if (loadedSize < toLoad) { someMoreWork = 0; break; }   /* not enough input, wait for more */

                /* decode loaded input */
                zds->inPos = 0;   /* input is consumed */
                FORWARD_IF_ERROR(ZSTD_decompressContinueStream(zds, &op, oend, zds->inBuff, neededInSize), "");
                /* Function modifies the stage so we must break */
                break;
            }
        case zdss_flush:
            {   size_t const toFlushSize = zds->outEnd - zds->outStart;
                size_t const flushedSize = ZSTD_limitCopy(op, (size_t)(oend-op), zds->outBuff + zds->outStart, toFlushSize);
                op += flushedSize;
                zds->outStart += flushedSize;
                if (flushedSize == toFlushSize) {  /* flush completed */
                    zds->streamStage = zdss_read;
                    if ( (zds->outBuffSize < zds->fParams.frameContentSize)
                      && (zds->outStart + zds->fParams.blockSizeMax > zds->outBuffSize) ) {
                        DEBUGLOG(5, "restart filling outBuff from beginning (left:%i, needed:%u)",
                                (int)(zds->outBuffSize - zds->outStart),
                                (U32)zds->fParams.blockSizeMax);
                        zds->outStart = zds->outEnd = 0;
                    }
                    break;
            }   }
            /* cannot complete flush */
            someMoreWork = 0;
            break;

        default:
            assert(0);    /* impossible */
            RETURN_ERROR(GENERIC, "impossible to reach");   /* some compiler require default to do something */
    }   }

    /* result */
    input->pos = (size_t)(ip - (const char*)(input->src));
    output->pos = (size_t)(op - (char*)(output->dst));

    /* Update the expected output buffer for ZSTD_obm_stable. */
    zds->expectedOutBuffer = *output;

    if ((ip==istart) && (op==ostart)) {  /* no forward progress */
        zds->noForwardProgress ++;
        if (zds->noForwardProgress >= ZSTD_NO_FORWARD_PROGRESS_MAX) {
            RETURN_ERROR_IF(op==oend, dstSize_tooSmall, "");
            RETURN_ERROR_IF(ip==iend, srcSize_wrong, "");
            assert(0);
        }
    } else {
        zds->noForwardProgress = 0;
    }
    {   size_t nextSrcSizeHint = ZSTD_nextSrcSizeToDecompress(zds);
        if (!nextSrcSizeHint) {   /* frame fully decoded */
            if (zds->outEnd == zds->outStart) {  /* output fully flushed */
                if (zds->hostageByte) {
                    if (input->pos >= input->size) {
                        /* can't release hostage (not present) */
                        zds->streamStage = zdss_read;
                        return 1;
                    }
                    input->pos++;  /* release hostage */
                }   /* zds->hostageByte */
                return 0;
            }  /* zds->outEnd == zds->outStart */
            if (!zds->hostageByte) { /* output not fully flushed; keep last byte as hostage; will be released when all output is flushed */
                input->pos--;   /* note : pos > 0, otherwise, impossible to finish reading last block */
                zds->hostageByte=1;
            }
            return 1;
        }  /* nextSrcSizeHint==0 */
        nextSrcSizeHint += ZSTD_blockHeaderSize * (ZSTD_nextInputType(zds) == ZSTDnit_block);   /* preload header of next block */
        assert(zds->inPos <= nextSrcSizeHint);
        nextSrcSizeHint -= zds->inPos;   /* part already loaded*/
        return nextSrcSizeHint;
    }
}